

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O1

int s_mp_exptmod(mp_int *G,mp_int *X,mp_int *P,mp_int *Y,int redmode)

{
  undefined8 uVar1;
  int iVar2;
  uint uVar3;
  mp_digit *pmVar4;
  code *pcVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  mp_int *pmVar9;
  mp_digit mVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  mp_digit **ppmVar14;
  int iVar15;
  long lVar16;
  mp_int *pmVar17;
  mp_int res;
  mp_int mu;
  mp_int t;
  mp_int M [256];
  int local_18dc;
  mp_int local_18c8;
  mp_int *local_18a8;
  mp_int *local_18a0;
  mp_int local_1898;
  mp_int *local_1880;
  long local_1878;
  ulong local_1870;
  mp_int *local_1868;
  ulong local_1860;
  mp_int local_1858;
  mp_int mStack_1838;
  mp_int local_1820 [255];
  
  iVar6 = X->used;
  if ((long)iVar6 == 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = (iVar6 + -1) * 0x3c;
    uVar12 = X->dp[(long)iVar6 + -1];
    if (uVar12 != 0) {
      lVar11 = 0x3f;
      if (uVar12 != 0) {
        for (; uVar12 >> lVar11 == 0; lVar11 = lVar11 + -1) {
        }
      }
      iVar2 = (iVar2 - ((uint)lVar11 ^ 0x3f)) + 0x40;
    }
  }
  uVar12 = 2;
  if ((((7 < iVar2) && (uVar12 = 3, 0x24 < iVar2)) && (uVar12 = 4, 0x8c < iVar2)) &&
     ((uVar12 = 5, 0x1c2 < iVar2 && (uVar12 = 6, 0x517 < iVar2)))) {
    uVar12 = (ulong)((0xdc9 < iVar2) + 7);
  }
  local_18a0 = G;
  local_1820[0].dp = (mp_digit *)malloc(0x100);
  if (local_1820[0].dp == (mp_digit *)0x0) {
    return -2;
  }
  memset(local_1820[0].dp,0,0x100);
  local_1820[0].used = 0;
  local_1820[0].alloc = 0x20;
  local_1820[0].sign = 0;
  iVar6 = (int)uVar12 + -1;
  uVar3 = 1 << ((byte)iVar6 & 0x1f);
  uVar7 = 1 << (sbyte)uVar12;
  local_18a8 = P;
  local_1880 = X;
  local_1868 = Y;
  local_1860 = uVar12;
  if (uVar3 < uVar7) {
    local_1870 = (ulong)uVar3;
    local_1878 = local_1870 * 3;
    ppmVar14 = &local_1820[local_1870 - 1].dp;
    lVar11 = local_1870 - uVar7;
    lVar16 = 0;
    do {
      pmVar4 = (mp_digit *)malloc(0x100);
      *ppmVar14 = pmVar4;
      if (pmVar4 == (mp_digit *)0x0) {
        if (uVar3 < (uint)((int)local_1870 - (int)lVar16)) {
          lVar16 = -lVar16;
          pmVar9 = (mp_int *)(&mStack_1838.used + local_1878 * 2);
          do {
            mp_clear(pmVar9);
            pmVar9 = pmVar9 + 1;
            lVar16 = lVar16 + -1;
          } while (lVar16 != 0);
        }
        pmVar4 = local_1820[0].dp;
        if (local_1820[0].dp == (mp_digit *)0x0) {
          return -2;
        }
        if (0 < (long)local_1820[0].used) {
          memset(local_1820[0].dp,0,(long)local_1820[0].used << 3);
        }
        free(pmVar4);
        return -2;
      }
      memset(pmVar4,0,0x100);
      ((mp_int *)(ppmVar14 + -2))->used = 0;
      ((mp_int *)(ppmVar14 + -2))->alloc = 0x20;
      *(int *)(ppmVar14 + -1) = 0;
      lVar16 = lVar16 + -1;
      ppmVar14 = ppmVar14 + 3;
    } while (lVar11 != lVar16);
  }
  local_1898.dp = (mp_digit *)malloc(0x100);
  if (local_1898.dp == (mp_digit *)0x0) {
    iVar2 = -2;
    goto LAB_00107e4e;
  }
  memset(local_1898.dp,0,0x100);
  pmVar9 = local_18a8;
  local_1898.used = 0;
  local_1898.alloc = 0x20;
  local_1898.sign = 0;
  if (redmode == 0) {
    iVar2 = mp_reduce_setup(&local_1898,local_18a8);
    if (iVar2 == 0) {
      pcVar5 = mp_reduce;
      goto LAB_00107dc8;
    }
  }
  else {
    iVar2 = mp_reduce_2k_setup_l(local_18a8,&local_1898);
    if (iVar2 == 0) {
      pcVar5 = mp_reduce_2k_l;
LAB_00107dc8:
      iVar2 = mp_mod(local_18a0,pmVar9,local_1820);
      if (iVar2 == 0) {
        uVar12 = (ulong)uVar3;
        pmVar17 = &mStack_1838 + uVar12;
        iVar2 = mp_copy(local_1820,pmVar17);
        if (iVar2 == 0) {
          iVar15 = 1;
          if (1 < iVar6) {
            iVar15 = iVar6;
          }
          do {
            iVar2 = s_mp_sqr(pmVar17,pmVar17);
            local_1820[uVar12 - 1].sign = 0;
            if ((iVar2 != 0) || (iVar2 = (*pcVar5)(pmVar17,pmVar9,&local_1898), iVar2 != 0))
            goto LAB_00107e10;
            iVar15 = iVar15 + -1;
          } while (iVar15 != 0);
          pmVar9 = &mStack_1838 + uVar12;
          do {
            uVar12 = uVar12 + 1;
            if (uVar7 <= uVar12) {
              pmVar4 = (mp_digit *)malloc(0x100);
              local_18c8.dp = pmVar4;
              if (pmVar4 != (mp_digit *)0x0) {
                memset(pmVar4,0,0x100);
                local_18c8._8_8_ = local_18c8._8_8_ & 0xffffffff00000000;
                local_18a0 = (mp_int *)0x0;
                local_18c8.used = 0;
                local_18c8.alloc = 0x20;
                memset(pmVar4,0,0x100);
                *pmVar4 = 1;
                local_18c8.used = 1;
                iVar15 = local_1880->used + -1;
                iVar13 = 1;
                mVar10 = 0;
                local_18dc = 0;
                iVar6 = 0;
                goto LAB_00108035;
              }
              iVar2 = -2;
              break;
            }
            pmVar17 = pmVar9 + 1;
            iVar2 = mp_mul(pmVar9,local_1820,pmVar17);
            if (iVar2 != 0) break;
            pmVar9 = pmVar9 + 1;
            iVar2 = (*pcVar5)(pmVar17,local_18a8,&local_1898);
          } while (iVar2 == 0);
        }
      }
    }
  }
  goto LAB_00107e10;
  while( true ) {
    iVar2 = (*pcVar5)(&local_18c8,local_18a8,&local_1898);
    iVar6 = 1;
    local_18a0 = (mp_int *)0x0;
    local_18dc = 0;
    if (iVar2 != 0) break;
LAB_00108035:
    do {
      while( true ) {
        do {
          iVar2 = iVar6;
          pmVar9 = local_18a8;
          iVar13 = iVar13 + -1;
          if (iVar13 == 0) {
            if (iVar15 == -1) {
              if (local_18dc < 1 || iVar2 != 2) goto LAB_00108224;
              pmVar17 = local_18a0;
              goto LAB_001081c1;
            }
            lVar11 = (long)iVar15;
            iVar15 = iVar15 + -1;
            mVar10 = local_1880->dp[lVar11];
            iVar13 = 0x3c;
          }
          uVar8 = (uint)(mVar10 >> 0x3b) & 1;
          mVar10 = mVar10 * 2;
          iVar6 = 0;
        } while (iVar2 == 0 && uVar8 == 0);
        if ((iVar2 != 1) || (uVar8 != 0)) break;
        iVar2 = s_mp_sqr(&local_18c8,&local_18c8);
        local_18c8._8_8_ = local_18c8._8_8_ & 0xffffffff00000000;
        if (iVar2 != 0) goto LAB_00108269;
        iVar2 = (*pcVar5)(&local_18c8,local_18a8,&local_1898);
        iVar6 = 1;
        if (iVar2 != 0) goto LAB_00108269;
      }
      local_18dc = local_18dc + 1;
      local_18a0 = (mp_int *)
                   (ulong)((uint)local_18a0 | uVar8 << ((char)local_1860 - (char)local_18dc & 0x1fU)
                          );
      iVar6 = 2;
      uVar12 = local_1860 & 0xffffffff;
    } while ((int)local_1860 != local_18dc);
    do {
      iVar2 = s_mp_sqr(&local_18c8,&local_18c8);
      local_18c8._8_8_ = local_18c8._8_8_ & 0xffffffff00000000;
      if ((iVar2 != 0) || (iVar2 = (*pcVar5)(&local_18c8,local_18a8,&local_1898), iVar2 != 0))
      goto LAB_00108269;
      uVar8 = (int)uVar12 - 1;
      uVar12 = (ulong)uVar8;
    } while (uVar8 != 0);
    iVar2 = mp_mul(&local_18c8,&mStack_1838 + (int)local_18a0,&local_18c8);
    if (iVar2 != 0) break;
  }
  goto LAB_00108269;
  while (local_18dc = local_18dc + -1, local_18dc != 0) {
LAB_001081c1:
    iVar2 = s_mp_sqr(&local_18c8,&local_18c8);
    local_18c8._8_8_ = local_18c8._8_8_ & 0xffffffff00000000;
    if (((iVar2 != 0) || (iVar2 = (*pcVar5)(&local_18c8,pmVar9,&local_1898), iVar2 != 0)) ||
       ((uVar8 = (int)pmVar17 * 2, pmVar17 = (mp_int *)(ulong)uVar8, (uVar7 & uVar8) != 0 &&
        ((iVar2 = mp_mul(&local_18c8,local_1820,&local_18c8), iVar2 != 0 ||
         (iVar2 = (*pcVar5)(&local_18c8,pmVar9,&local_1898), iVar2 != 0)))))) goto LAB_00108269;
  }
LAB_00108224:
  local_1858.dp = local_18c8.dp;
  local_1858.used = local_18c8.used;
  local_1858.alloc = local_18c8.alloc;
  local_1858.sign = local_18c8.sign;
  local_1858._12_4_ = local_18c8._12_4_;
  pmVar4 = local_1868->dp;
  uVar1._0_4_ = local_1868->used;
  uVar1._4_4_ = local_1868->alloc;
  uVar12 = *(ulong *)&local_1868->sign;
  local_1868->used = local_18c8.used;
  local_1868->alloc = local_18c8.alloc;
  local_1868->sign = local_18c8.sign;
  *(undefined4 *)&local_1868->field_0xc = local_18c8._12_4_;
  local_1868->dp = local_18c8.dp;
  iVar2 = 0;
  local_18c8._0_8_ = uVar1;
  local_18c8._8_8_ = uVar12;
  local_18c8.dp = pmVar4;
LAB_00108269:
  pmVar4 = local_18c8.dp;
  if (local_18c8.dp != (mp_digit *)0x0) {
    if (0 < (long)local_18c8.used) {
      memset(local_18c8.dp,0,(long)local_18c8.used << 3);
    }
    free(pmVar4);
    local_18c8.dp = (mp_digit *)0x0;
    local_18c8.used = 0;
    local_18c8.alloc = 0;
    local_18c8._8_8_ = local_18c8._8_8_ & 0xffffffff00000000;
  }
LAB_00107e10:
  pmVar4 = local_1898.dp;
  if (local_1898.dp != (mp_digit *)0x0) {
    if (0 < (long)local_1898.used) {
      memset(local_1898.dp,0,(long)local_1898.used << 3);
    }
    free(pmVar4);
    local_1898.dp = (mp_digit *)0x0;
    local_1898.used = 0;
    local_1898.alloc = 0;
    local_1898.sign = 0;
  }
LAB_00107e4e:
  pmVar4 = local_1820[0].dp;
  if (local_1820[0].dp != (mp_digit *)0x0) {
    if (0 < (long)local_1820[0].used) {
      memset(local_1820[0].dp,0,(long)local_1820[0].used << 3);
    }
    free(pmVar4);
    local_1820[0].dp = (mp_digit *)0x0;
    local_1820[0].used = 0;
    local_1820[0].alloc = 0;
    local_1820[0].sign = 0;
  }
  if (uVar3 < uVar7) {
    pmVar9 = &mStack_1838 + uVar3;
    lVar11 = (ulong)uVar7 - (ulong)uVar3;
    do {
      mp_clear(pmVar9);
      pmVar9 = pmVar9 + 1;
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
  }
  return iVar2;
}

Assistant:

int s_mp_exptmod (mp_int * G, mp_int * X, mp_int * P, mp_int * Y, int redmode)
{
  mp_int  M[TAB_SIZE], res, mu;
  mp_digit buf;
  int     err, bitbuf, bitcpy, bitcnt, mode, digidx, x, y, winsize;
  int (*redux)(mp_int*,mp_int*,mp_int*);

  /* find window size */
  x = mp_count_bits (X);
  if (x <= 7) {
    winsize = 2;
  } else if (x <= 36) {
    winsize = 3;
  } else if (x <= 140) {
    winsize = 4;
  } else if (x <= 450) {
    winsize = 5;
  } else if (x <= 1303) {
    winsize = 6;
  } else if (x <= 3529) {
    winsize = 7;
  } else {
    winsize = 8;
  }

  /* init M array */
  /* init first cell */
  if ((err = mp_init(&M[1])) != MP_OKAY) {
     return err; 
  }

  /* now init the second half of the array */
  for (x = 1<<(winsize-1); x < (1 << winsize); x++) {
    if ((err = mp_init(&M[x])) != MP_OKAY) {
      for (y = 1<<(winsize-1); y < x; y++) {
        mp_clear (&M[y]);
      }
      mp_clear(&M[1]);
      return err;
    }
  }

  /* create mu, used for Barrett reduction */
  if ((err = mp_init (&mu)) != MP_OKAY) {
    goto LBL_M;
  }
  
  if (redmode == 0) {
     if ((err = mp_reduce_setup (&mu, P)) != MP_OKAY) {
        goto LBL_MU;
     }
     redux = mp_reduce;
  } else {
     if ((err = mp_reduce_2k_setup_l (P, &mu)) != MP_OKAY) {
        goto LBL_MU;
     }
     redux = mp_reduce_2k_l;
  }    

  /* create M table
   *
   * The M table contains powers of the base, 
   * e.g. M[x] = G**x mod P
   *
   * The first half of the table is not 
   * computed though accept for M[0] and M[1]
   */
  if ((err = mp_mod (G, P, &M[1])) != MP_OKAY) {
    goto LBL_MU;
  }

  /* compute the value at M[1<<(winsize-1)] by squaring 
   * M[1] (winsize-1) times 
   */
  if ((err = mp_copy (&M[1], &M[1 << (winsize - 1)])) != MP_OKAY) {
    goto LBL_MU;
  }

  for (x = 0; x < (winsize - 1); x++) {
    /* square it */
    if ((err = mp_sqr (&M[1 << (winsize - 1)], 
                       &M[1 << (winsize - 1)])) != MP_OKAY) {
      goto LBL_MU;
    }

    /* reduce modulo P */
    if ((err = redux (&M[1 << (winsize - 1)], P, &mu)) != MP_OKAY) {
      goto LBL_MU;
    }
  }

  /* create upper table, that is M[x] = M[x-1] * M[1] (mod P)
   * for x = (2**(winsize - 1) + 1) to (2**winsize - 1)
   */
  for (x = (1 << (winsize - 1)) + 1; x < (1 << winsize); x++) {
    if ((err = mp_mul (&M[x - 1], &M[1], &M[x])) != MP_OKAY) {
      goto LBL_MU;
    }
    if ((err = redux (&M[x], P, &mu)) != MP_OKAY) {
      goto LBL_MU;
    }
  }

  /* setup result */
  if ((err = mp_init (&res)) != MP_OKAY) {
    goto LBL_MU;
  }
  mp_set (&res, 1);

  /* set initial mode and bit cnt */
  mode   = 0;
  bitcnt = 1;
  buf    = 0;
  digidx = X->used - 1;
  bitcpy = 0;
  bitbuf = 0;

  for (;;) {
    /* grab next digit as required */
    if (--bitcnt == 0) {
      /* if digidx == -1 we are out of digits */
      if (digidx == -1) {
        break;
      }
      /* read next digit and reset the bitcnt */
      buf    = X->dp[digidx--];
      bitcnt = (int) DIGIT_BIT;
    }

    /* grab the next msb from the exponent */
    y     = (buf >> (mp_digit)(DIGIT_BIT - 1)) & 1;
    buf <<= (mp_digit)1;

    /* if the bit is zero and mode == 0 then we ignore it
     * These represent the leading zero bits before the first 1 bit
     * in the exponent.  Technically this opt is not required but it
     * does lower the # of trivial squaring/reductions used
     */
    if (mode == 0 && y == 0) {
      continue;
    }

    /* if the bit is zero and mode == 1 then we square */
    if (mode == 1 && y == 0) {
      if ((err = mp_sqr (&res, &res)) != MP_OKAY) {
        goto LBL_RES;
      }
      if ((err = redux (&res, P, &mu)) != MP_OKAY) {
        goto LBL_RES;
      }
      continue;
    }

    /* else we add it to the window */
    bitbuf |= (y << (winsize - ++bitcpy));
    mode    = 2;

    if (bitcpy == winsize) {
      /* ok window is filled so square as required and multiply  */
      /* square first */
      for (x = 0; x < winsize; x++) {
        if ((err = mp_sqr (&res, &res)) != MP_OKAY) {
          goto LBL_RES;
        }
        if ((err = redux (&res, P, &mu)) != MP_OKAY) {
          goto LBL_RES;
        }
      }

      /* then multiply */
      if ((err = mp_mul (&res, &M[bitbuf], &res)) != MP_OKAY) {
        goto LBL_RES;
      }
      if ((err = redux (&res, P, &mu)) != MP_OKAY) {
        goto LBL_RES;
      }

      /* empty window and reset */
      bitcpy = 0;
      bitbuf = 0;
      mode   = 1;
    }
  }

  /* if bits remain then square/multiply */
  if (mode == 2 && bitcpy > 0) {
    /* square then multiply if the bit is set */
    for (x = 0; x < bitcpy; x++) {
      if ((err = mp_sqr (&res, &res)) != MP_OKAY) {
        goto LBL_RES;
      }
      if ((err = redux (&res, P, &mu)) != MP_OKAY) {
        goto LBL_RES;
      }

      bitbuf <<= 1;
      if ((bitbuf & (1 << winsize)) != 0) {
        /* then multiply */
        if ((err = mp_mul (&res, &M[1], &res)) != MP_OKAY) {
          goto LBL_RES;
        }
        if ((err = redux (&res, P, &mu)) != MP_OKAY) {
          goto LBL_RES;
        }
      }
    }
  }

  mp_exch (&res, Y);
  err = MP_OKAY;
LBL_RES:mp_clear (&res);
LBL_MU:mp_clear (&mu);
LBL_M:
  mp_clear(&M[1]);
  for (x = 1<<(winsize-1); x < (1 << winsize); x++) {
    mp_clear (&M[x]);
  }
  return err;
}